

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O1

void anon_unknown.dwarf_14525e::compareBufferRelative
               (SimdAlignedBuffer64f *src,SimdAlignedBuffer64f *dst,float relErrThresh,
               float absErrThresh)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  float fVar4;
  double dVar5;
  
  lVar3 = 0;
  do {
    fVar4 = ABS(src->_buffer[lVar3] - dst->_buffer[lVar3]);
    if (absErrThresh < fVar4) {
      dVar5 = (double)fVar4;
      dVar1 = dVar5 / (double)ABS(src->_buffer[lVar3]);
      if ((double)relErrThresh < dVar1) {
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             0x100;
        poVar2 = std::operator<<((ostream *)&std::cout,"Error exceeded threshold on element ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout," diff: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
        poVar2 = std::operator<<(poVar2," relErr: ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1 * 100.0);
        poVar2 = std::operator<<(poVar2," %");
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"Goal (src): ");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 0x100;
        std::endl<char,std::char_traits<char>>(poVar2);
        dumpBuffer(src);
        poVar2 = std::operator<<((ostream *)&std::cout,"Test (dst): ");
        std::endl<char,std::char_traits<char>>(poVar2);
        dumpBuffer(dst);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                      ,0x71,
                      "void (anonymous namespace)::compareBufferRelative(const SimdAlignedBuffer64f &, const SimdAlignedBuffer64f &, const float, const float)"
                     );
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void
compareBufferRelative (const SimdAlignedBuffer64f &src,
                       const SimdAlignedBuffer64f &dst,
                       const float                 relErrThresh,
                       const float                 absErrThresh)
{
    for (int i=0; i<64; ++i)
    {
        double diff    = fabs(src._buffer[i] - dst._buffer[i]);
        double relDiff = diff / fabs(src._buffer[i]);

        if (relDiff > relErrThresh && diff > absErrThresh)
        {
            cout << scientific;
            cout << "Error exceeded threshold on element "  << i << endl;
            cout << " diff: " << diff << " relErr: " << fixed << 100.0*relDiff << " %" << endl;
            cout << "Goal (src): " << scientific << endl;
            dumpBuffer(src);
            cout << "Test (dst): " << endl;
            dumpBuffer(dst);

            assert(false);
        }
    }
}